

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node * prvTidyTrimEmptyElement(TidyDocImpl *doc,Node *element)

{
  Bool BVar1;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  BVar1 = CanPrune(doc,element);
  if (BVar1 == no) {
    doc_local = (TidyDocImpl *)element->next;
  }
  else {
    if (element->type != TextNode) {
      doc->footnotes = doc->footnotes | 1;
      prvTidyReport(doc,element,(Node *)0x0,0x281);
    }
    doc_local = (TidyDocImpl *)prvTidyDiscardElement(doc,element);
  }
  return &doc_local->root;
}

Assistant:

Node *TY_(TrimEmptyElement)( TidyDocImpl* doc, Node *element )
{
    if ( CanPrune(doc, element) )
    {
        if (element->type != TextNode)
        {
            doc->footnotes |= FN_TRIM_EMPTY_ELEMENT;
            TY_(Report)(doc, element, NULL, TRIM_EMPTY_ELEMENT);
        }
        
        return TY_(DiscardElement)(doc, element);
    }
    return element->next;
}